

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

spv_result_t
spvTextEncodeOperand
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_operand_type_t type,char *textValue
          ,spv_instruction_t *pInst,spv_operand_pattern_t *pExpectedOperands)

{
  Op OVar1;
  pointer puVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  spv_result_t sVar5;
  uint32_t value_00;
  spv_result_t sVar6;
  spv_ext_inst_type_t sVar7;
  char *pcVar8;
  size_t name_len;
  DiagnosticStream *pDVar9;
  IdType *type_00;
  spv_operand_type_t *types;
  spv_opcode_desc d;
  uint32_t value;
  undefined1 auStack_234 [12];
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  IdType expected_type;
  spv_result_t local_38;
  
  if (*textValue == '!') {
    sVar5 = anon_unknown.dwarf_257ce77::encodeImmediate(context,textValue,pInst);
    if (sVar5 == SPV_SUCCESS) {
      spvAlternatePatternFollowingImmediate
                ((spv_operand_pattern_t *)&expected_type,pExpectedOperands);
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::_M_move_assign
                (pExpectedOperands,&expected_type);
      std::_Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::~_Vector_base
                ((_Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                 &expected_type);
      return SPV_SUCCESS;
    }
    return sVar5;
  }
  bVar4 = spvOperandIsOptional(type);
  if (0x3c < type - SPV_OPERAND_TYPE_ID) {
    if ((type - SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS < 0xf) &&
       ((0x5a01U >> (type - SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS & 0x1f) & 1) != 0)
       ) goto switchD_0051652f_caseD_23;
switchD_0051652f_caseD_c:
    name_len = strlen(textValue);
    sVar5 = spvtools::AssemblyGrammar::lookupOperand
                      (grammar,type,textValue,name_len,(spv_operand_desc *)&value);
    if (sVar5 == SPV_SUCCESS) {
      sVar5 = spvtools::AssemblyContext::binaryEncodeU32(context,_value->opcode,pInst);
      if (sVar5 == SPV_SUCCESS) {
        types = _value->operandTypes + 3;
LAB_00516ca8:
        spvPushOperandTypes(types,pExpectedOperands);
        return SPV_SUCCESS;
      }
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
    std::operator<<((ostream *)&expected_type,"Invalid ");
LAB_005168aa:
    pcVar8 = spvOperandTypeStr(type);
    std::operator<<((ostream *)&expected_type,pcVar8);
    pcVar8 = " \'";
    goto LAB_00516639;
  }
  sVar5 = (uint)bVar4 + (uint)bVar4 * 8 + SPV_ERROR_INVALID_TEXT;
  switch(type) {
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_TYPE_ID:
  case SPV_OPERAND_TYPE_RESULT_ID:
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
  case SPV_OPERAND_TYPE_SCOPE_ID:
  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
    if (*textValue != '%') {
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
      pcVar8 = "Expected id to start with %.";
LAB_005166aa:
      std::operator<<((ostream *)&expected_type,pcVar8);
      goto LAB_005166bb;
    }
    textValue = textValue + 1;
    bVar4 = spvIsValidID(textValue);
    if (bVar4) {
      value_00 = spvtools::AssemblyContext::spvNamedIdAssignOrGet(context,textValue);
      if (type == SPV_OPERAND_TYPE_TYPE_ID) {
        pInst->resultTypeId = value_00;
      }
      spvInstructionAddWord(pInst,value_00);
      bVar4 = spvIsExtendedInstruction(pInst->opcode);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      puVar2 = (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 != 0x10) {
        return SPV_SUCCESS;
      }
      sVar7 = spvtools::AssemblyContext::getExtInstTypeForId(context,puVar2[3]);
      if (sVar7 != SPV_EXT_INST_TYPE_NONE) {
        pInst->extInstType = sVar7;
        return SPV_SUCCESS;
      }
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
      std::operator<<((ostream *)&expected_type,"Invalid extended instruction import Id ");
      pDVar9 = spvtools::DiagnosticStream::operator<<
                         ((DiagnosticStream *)&expected_type,
                          (pInst->words).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + 2);
      local_38 = pDVar9->error_;
      goto LAB_005166bb;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
    pcVar8 = "Invalid ID ";
    break;
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
    expected_type.type_class = kScalarIntegerType;
    goto LAB_00516961;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    sVar5 = spvtools::AssemblyGrammar::lookupExtInst
                      (grammar,pInst->extInstType,textValue,(spv_ext_inst_desc *)&d);
    if (sVar5 == SPV_SUCCESS) {
      spvInstructionAddWord(pInst,*(uint32_t *)(CONCAT44(d._4_4_,(Op)d) + 8));
      types = (spv_operand_type_t *)(CONCAT44(d._4_4_,(Op)d) + 0x18);
      goto LAB_00516ca8;
    }
    bVar4 = spvExtInstIsNonSemantic(pInst->extInstType);
    if (bVar4) {
      local_228._M_p = (pointer)&local_218;
      local_220 = 0;
      local_218._M_local_buf[0] = '\0';
      sVar5 = spvTextToLiteral(textValue,(spv_literal_t *)&value);
      if (value != 2 || sVar5 != SPV_SUCCESS) {
        spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
        std::operator<<((ostream *)&expected_type,
                        "Couldn\'t translate unknown extended instruction name \'");
        std::operator<<((ostream *)&expected_type,textValue);
        std::operator<<((ostream *)&expected_type,"\' to unsigned integer.");
        context = (AssemblyContext *)(ulong)(uint)local_38;
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&expected_type);
      }
      else {
        spvInstructionAddWord(pInst,auStack_234._4_4_);
        expected_type.bitwidth = 0x34;
        std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
        emplace_back<spv_operand_type_t>(pExpectedOperands,&expected_type.bitwidth);
      }
      std::__cxx11::string::_M_dispose();
      if (value == 2 && sVar5 == SPV_SUCCESS) {
        return SPV_SUCCESS;
      }
      return (spv_result_t)context;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
    pcVar8 = "Invalid extended instruction name \'";
    goto LAB_00516639;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    sVar5 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode(grammar,textValue,(Op *)&d);
    if (sVar5 == SPV_SUCCESS) {
      auVar3._4_8_ = 0;
      auVar3._0_4_ = auStack_234._4_4_;
      _value = (IdType)(auVar3 << 0x40);
      sVar5 = spvtools::AssemblyGrammar::lookupOpcode(grammar,(Op)d,(spv_opcode_desc *)&value);
      if (sVar5 == SPV_SUCCESS) {
        spvInstructionAddWord(pInst,_value->opcode);
        if (_value->hasType == false) {
          __assert_fail("opcodeEntry->hasType",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/text.cpp"
                        ,0x128,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        if (_value->hasResult == false) {
          __assert_fail("opcodeEntry->hasResult",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/text.cpp"
                        ,0x129,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        if ((ushort)*(uint32_t *)&_value->numTypes < 2) {
          __assert_fail("opcodeEntry->numTypes >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/text.cpp"
                        ,0x12a,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        types = _value->operandTypes + 2;
        goto LAB_00516ca8;
      }
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)&expected_type,context,SPV_ERROR_INTERNAL);
      pcVar8 = "OpSpecConstant opcode table out of sync";
      goto LAB_005166aa;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
    std::operator<<((ostream *)&expected_type,"Invalid ");
    type = SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER;
    goto LAB_005168aa;
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    _value = (IdType)ZEXT812(0);
    OVar1 = pInst->opcode;
    if (OVar1 != OpConstant) {
      if (OVar1 == OpSwitch) {
        _value = spvtools::AssemblyContext::getTypeOfValueInstruction
                           (context,(pInst->words).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[1]);
        if (value._8_4_ != kScalarIntegerType) {
          spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
          pcVar8 = 
          "The selector operand for OpSwitch must be the result of an instruction that generates an integer scalar"
          ;
          goto LAB_005166aa;
        }
      }
      else if (OVar1 == OpSpecConstant) goto LAB_005167a9;
LAB_00516a3d:
      type_00 = (IdType *)&value;
      goto LAB_00516a42;
    }
LAB_005167a9:
    _value = spvtools::AssemblyContext::getTypeOfTypeGeneratingValue(context,pInst->resultTypeId);
    if (value._8_4_ - kScalarIntegerType < 2) goto LAB_00516a3d;
    sVar5 = spvtools::AssemblyGrammar::lookupOpcode(grammar,pInst->opcode,&d);
    if (sVar5 == SPV_SUCCESS) {
      pcVar8 = *(char **)CONCAT44(d._4_4_,(Op)d);
    }
    else {
      pcVar8 = "opcode";
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
    std::operator<<((ostream *)&expected_type,"Type for ");
    std::operator<<((ostream *)&expected_type,pcVar8);
    textValue = " must be a scalar floating point or integer type";
    goto LAB_00516656;
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    expected_type.type_class = kScalarFloatType;
LAB_00516961:
    type_00 = &expected_type;
    expected_type.bitwidth = 0x20;
    expected_type.isSigned = false;
    expected_type._5_3_ = 0;
LAB_00516a42:
    sVar5 = spvtools::AssemblyContext::binaryEncodeNumericLiteral
                      (context,textValue,sVar5,type_00,pInst);
    if (sVar5 == SPV_SUCCESS) {
      return SPV_SUCCESS;
    }
    return sVar5;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
    _value = (spv_opcode_desc)(auStack_234._0_8_ << 0x20);
    auStack_234._4_4_ = kBottom;
    local_228._M_p = (pointer)&local_218;
    local_220 = 0;
    local_218._M_local_buf[0] = '\0';
    sVar6 = spvTextToLiteral(textValue,(spv_literal_t *)&value);
    if (sVar6 == SPV_ERROR_OUT_OF_MEMORY) goto LAB_00516cfc;
    if (sVar6 == SPV_SUCCESS) {
      if (value == 6) {
        if (pInst->opcode == OpExtInstImport) {
          sVar7 = spvExtInstImportTypeGet(local_228._M_p);
          if (sVar7 == SPV_EXT_INST_TYPE_NONE) {
            spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
            std::operator<<((ostream *)&expected_type,"Invalid extended instruction import \'");
            std::operator<<((ostream *)&expected_type,(string *)&local_228);
            std::operator<<((ostream *)&expected_type,"\'");
            spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&expected_type);
            sVar6 = local_38;
          }
          else {
            sVar6 = spvtools::AssemblyContext::recordIdAsExtInstImport
                              (context,(pInst->words).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1],sVar7);
            if (sVar6 == SPV_SUCCESS) goto LAB_00516b6a;
          }
LAB_00516cfc:
          bVar4 = false;
          local_38 = sVar6;
        }
        else {
LAB_00516b6a:
          sVar5 = spvtools::AssemblyContext::binaryEncodeString(context,local_228._M_p,pInst);
          bVar4 = sVar5 == SPV_SUCCESS;
          local_38 = (uint)bVar4 * 5 + SPV_ERROR_INVALID_TEXT;
        }
        goto LAB_00516cfe;
      }
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context);
      pcVar8 = "Expected literal string, found literal number \'";
    }
    else {
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context,sVar5);
      pcVar8 = "Invalid literal string \'";
    }
    std::operator<<((ostream *)&expected_type,pcVar8);
    std::operator<<((ostream *)&expected_type,textValue);
    std::operator<<((ostream *)&expected_type,"\'.");
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&expected_type);
    bVar4 = false;
LAB_00516cfe:
    std::__cxx11::string::_M_dispose();
    if (bVar4) {
      return SPV_SUCCESS;
    }
    return local_38;
  default:
    goto switchD_0051652f_caseD_c;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
switchD_0051652f_caseD_23:
    sVar5 = spvtools::AssemblyGrammar::parseMaskOperand(grammar,type,textValue,&value);
    if (sVar5 == SPV_SUCCESS) {
      sVar5 = spvtools::AssemblyContext::binaryEncodeU32(context,value,pInst);
      if (sVar5 == SPV_SUCCESS) {
        spvtools::AssemblyGrammar::pushOperandTypesForMask(grammar,type,value,pExpectedOperands);
        return SPV_SUCCESS;
      }
      return sVar5;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context,sVar5);
    std::operator<<((ostream *)&expected_type,"Invalid ");
    pcVar8 = spvOperandTypeStr(type);
    std::operator<<((ostream *)&expected_type,pcVar8);
    pcVar8 = " operand \'";
LAB_00516639:
    std::operator<<((ostream *)&expected_type,pcVar8);
    std::operator<<((ostream *)&expected_type,textValue);
    textValue = "\'.";
    goto LAB_00516656;
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    type_00 = (IdType *)&spvtools::kUnknownType;
    goto LAB_00516a42;
  case SPV_OPERAND_TYPE_OPTIONAL_CIV:
    sVar5 = spvTextEncodeOperand
                      (grammar,context,SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER,textValue,pInst,
                       pExpectedOperands);
    if ((sVar5 == SPV_FAILED_MATCH) &&
       (sVar5 = spvTextEncodeOperand
                          (grammar,context,SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,textValue,pInst,
                           pExpectedOperands), sVar5 == SPV_FAILED_MATCH)) {
      sVar5 = spvTextEncodeOperand
                        (grammar,context,SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE,textValue,pInst,
                         pExpectedOperands);
    }
    if (sVar5 == SPV_SUCCESS) {
      if ((pExpectedOperands->
          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (pExpectedOperands->
          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        return SPV_SUCCESS;
      }
      expected_type.bitwidth = 0x32;
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
      emplace_back<spv_operand_type_t>(pExpectedOperands,&expected_type.bitwidth);
      return SPV_SUCCESS;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&expected_type,context,sVar5);
    pcVar8 = "Invalid word following !<integer>: ";
  }
  std::operator<<((ostream *)&expected_type,pcVar8);
LAB_00516656:
  std::operator<<((ostream *)&expected_type,textValue);
LAB_005166bb:
  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&expected_type);
  return local_38;
}

Assistant:

spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar& grammar,
                                  spvtools::AssemblyContext* context,
                                  const spv_operand_type_t type,
                                  const char* textValue,
                                  spv_instruction_t* pInst,
                                  spv_operand_pattern_t* pExpectedOperands) {
  // NOTE: Handle immediate int in the stream
  if ('!' == textValue[0]) {
    if (auto error = encodeImmediate(context, textValue, pInst)) {
      return error;
    }
    *pExpectedOperands =
        spvAlternatePatternFollowingImmediate(*pExpectedOperands);
    return SPV_SUCCESS;
  }

  // Optional literal operands can fail to parse. In that case use
  // SPV_FAILED_MATCH to avoid emitting a diagnostic.  Use the following
  // for those situations.
  spv_result_t error_code_for_literals =
      spvOperandIsOptional(type) ? SPV_FAILED_MATCH : SPV_ERROR_INVALID_TEXT;

  switch (type) {
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_RESULT_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
    case SPV_OPERAND_TYPE_OPTIONAL_ID: {
      if ('%' == textValue[0]) {
        textValue++;
      } else {
        return context->diagnostic() << "Expected id to start with %.";
      }
      if (!spvIsValidID(textValue)) {
        return context->diagnostic() << "Invalid ID " << textValue;
      }
      const uint32_t id = context->spvNamedIdAssignOrGet(textValue);
      if (type == SPV_OPERAND_TYPE_TYPE_ID) pInst->resultTypeId = id;
      spvInstructionAddWord(pInst, id);

      // Set the extended instruction type.
      // The import set id is the 3rd operand of OpExtInst.
      if (spvIsExtendedInstruction(pInst->opcode) && pInst->words.size() == 4) {
        auto ext_inst_type = context->getExtInstTypeForId(pInst->words[3]);
        if (ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
          return context->diagnostic()
                 << "Invalid extended instruction import Id "
                 << pInst->words[2];
        }
        pInst->extInstType = ext_inst_type;
      }
    } break;

    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER: {
      // The assembler accepts the symbolic name for an extended instruction,
      // and emits its corresponding number.
      spv_ext_inst_desc extInst;
      if (grammar.lookupExtInst(pInst->extInstType, textValue, &extInst) ==
          SPV_SUCCESS) {
        // if we know about this extended instruction, push the numeric value
        spvInstructionAddWord(pInst, extInst->ext_inst);

        // Prepare to parse the operands for the extended instructions.
        spvPushOperandTypes(extInst->operandTypes, pExpectedOperands);
      } else {
        // if we don't know this extended instruction and the set isn't
        // non-semantic, we cannot process further
        if (!spvExtInstIsNonSemantic(pInst->extInstType)) {
          return context->diagnostic()
                 << "Invalid extended instruction name '" << textValue << "'.";
        } else {
          // for non-semantic instruction sets, as long as the text name is an
          // integer value we can encode it since we know the form of all such
          // extended instructions
          spv_literal_t extInstValue;
          if (spvTextToLiteral(textValue, &extInstValue) ||
              extInstValue.type != SPV_LITERAL_TYPE_UINT_32) {
            return context->diagnostic()
                   << "Couldn't translate unknown extended instruction name '"
                   << textValue << "' to unsigned integer.";
          }

          spvInstructionAddWord(pInst, extInstValue.value.u32);

          // opcode contains an unknown number of IDs.
          pExpectedOperands->push_back(SPV_OPERAND_TYPE_VARIABLE_ID);
        }
      }
    } break;

    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER: {
      // The assembler accepts the symbolic name for the opcode, but without
      // the "Op" prefix.  For example, "IAdd" is accepted.  The number
      // of the opcode is emitted.
      spv::Op opcode;
      if (grammar.lookupSpecConstantOpcode(textValue, &opcode)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      spv_opcode_desc opcodeEntry = nullptr;
      if (grammar.lookupOpcode(opcode, &opcodeEntry)) {
        return context->diagnostic(SPV_ERROR_INTERNAL)
               << "OpSpecConstant opcode table out of sync";
      }
      spvInstructionAddWord(pInst, uint32_t(opcodeEntry->opcode));

      // Prepare to parse the operands for the opcode.  Except skip the
      // type Id and result Id, since they've already been processed.
      assert(opcodeEntry->hasType);
      assert(opcodeEntry->hasResult);
      assert(opcodeEntry->numTypes >= 2);
      spvPushOperandTypes(opcodeEntry->operandTypes + 2, pExpectedOperands);
    } break;

    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER: {
      // The current operand is an *unsigned* 32-bit integer.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarIntegerType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_FLOAT: {
      // The current operand is a 32-bit float.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarFloatType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
      // This is a context-independent literal number which can be a 32-bit
      // number of floating point value.
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, spvtools::kUnknownType,
              pInst)) {
        return error;
      }
      break;

    case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER: {
      spvtools::IdType expected_type = spvtools::kUnknownType;
      // The encoding for OpConstant, OpSpecConstant and OpSwitch all
      // depend on either their own result-id or the result-id of
      // one of their parameters.
      if (spv::Op::OpConstant == pInst->opcode ||
          spv::Op::OpSpecConstant == pInst->opcode) {
        // The type of the literal is determined by the type Id of the
        // instruction.
        expected_type =
            context->getTypeOfTypeGeneratingValue(pInst->resultTypeId);
        if (!spvtools::isScalarFloating(expected_type) &&
            !spvtools::isScalarIntegral(expected_type)) {
          spv_opcode_desc d;
          const char* opcode_name = "opcode";
          if (SPV_SUCCESS == grammar.lookupOpcode(pInst->opcode, &d)) {
            opcode_name = d->name;
          }
          return context->diagnostic()
                 << "Type for " << opcode_name
                 << " must be a scalar floating point or integer type";
        }
      } else if (pInst->opcode == spv::Op::OpSwitch) {
        // The type of the literal is the same as the type of the selector.
        expected_type = context->getTypeOfValueInstruction(pInst->words[1]);
        if (!spvtools::isScalarIntegral(expected_type)) {
          return context->diagnostic()
                 << "The selector operand for OpSwitch must be the result"
                    " of an instruction that generates an integer scalar";
        }
      }
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_STRING:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING: {
      spv_literal_t literal = {};
      spv_result_t error = spvTextToLiteral(textValue, &literal);
      if (error != SPV_SUCCESS) {
        if (error == SPV_ERROR_OUT_OF_MEMORY) return error;
        return context->diagnostic(error_code_for_literals)
               << "Invalid literal string '" << textValue << "'.";
      }
      if (literal.type != SPV_LITERAL_TYPE_STRING) {
        return context->diagnostic()
               << "Expected literal string, found literal number '" << textValue
               << "'.";
      }

      // NOTE: Special case for extended instruction library import
      if (spv::Op::OpExtInstImport == pInst->opcode) {
        const spv_ext_inst_type_t ext_inst_type =
            spvExtInstImportTypeGet(literal.str.c_str());
        if (SPV_EXT_INST_TYPE_NONE == ext_inst_type) {
          return context->diagnostic()
                 << "Invalid extended instruction import '" << literal.str
                 << "'";
        }
        if ((error = context->recordIdAsExtInstImport(pInst->words[1],
                                                      ext_inst_type)))
          return error;
      }

      if (context->binaryEncodeString(literal.str.c_str(), pInst))
        return SPV_ERROR_INVALID_TEXT;
    } break;

    // Masks.
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
    case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
    case SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS: {
      uint32_t value;
      if (auto error = grammar.parseMaskOperand(type, textValue, &value)) {
        return context->diagnostic(error)
               << "Invalid " << spvOperandTypeStr(type) << " operand '"
               << textValue << "'.";
      }
      if (auto error = context->binaryEncodeU32(value, pInst)) return error;
      // Prepare to parse the operands for this logical operand.
      grammar.pushOperandTypesForMask(type, value, pExpectedOperands);
    } break;
    case SPV_OPERAND_TYPE_OPTIONAL_CIV: {
      auto error = spvTextEncodeOperand(
          grammar, context, SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER, textValue,
          pInst, pExpectedOperands);
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal number -- is it a literal string?
        error = spvTextEncodeOperand(grammar, context,
                                     SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,
                                     textValue, pInst, pExpectedOperands);
      }
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal -- is it an ID?
        error =
            spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_OPTIONAL_ID,
                                 textValue, pInst, pExpectedOperands);
      }
      if (error) {
        return context->diagnostic(error)
               << "Invalid word following !<integer>: " << textValue;
      }
      if (pExpectedOperands->empty()) {
        pExpectedOperands->push_back(SPV_OPERAND_TYPE_OPTIONAL_CIV);
      }
    } break;
    default: {
      // NOTE: All non literal operands are handled here using the operand
      // table.
      spv_operand_desc entry;
      if (grammar.lookupOperand(type, textValue, strlen(textValue), &entry)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      if (context->binaryEncodeU32(entry->value, pInst)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }

      // Prepare to parse the operands for this logical operand.
      spvPushOperandTypes(entry->operandTypes, pExpectedOperands);
    } break;
  }
  return SPV_SUCCESS;
}